

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmResourceInfoCommon::CreateCustomRes_2
          (GmmResourceInfoCommon *this,Context *GmmLibContext,
          GMM_RESCREATE_CUSTOM_PARAMS_2 *CreateParams)

{
  GMM_TEXTURE_INFO *pTexInfo;
  undefined1 *puVar1;
  anon_struct_8_44_94931171_for_Info *paVar2;
  uint8_t *puVar3;
  ushort uVar4;
  uint32_t uVar5;
  anon_struct_8_44_94931171_for_Info aVar6;
  uint8_t uVar7;
  GMM_CLIENT GVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GMM_TEXTURE_CALC *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GMM_GFX_SIZE_T GVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  
  if (this->pClientContext == (GmmClientContext *)0x0) {
    GVar8 = GMM_UNDEFINED_CLIENT;
  }
  else {
    GVar8 = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  this->ClientType = GVar8;
  this->pGmmUmdLibContext = (uint64_t)GmmLibContext;
  if ((CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Format - GMM_FORMAT_A1B5G5R5_UNORM < 0x180)
  {
    iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    uVar4 = *(ushort *)
             (*(long *)(CONCAT44(extraout_var,iVar9) + 8) + 0x181c +
             (ulong)(CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Format * 0x14);
    iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar9));
    iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    this_00 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_01,iVar9));
    pTexInfo = &this->Surf;
    (this->Surf).Type = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Type;
    (this->Surf).Format = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Format;
    (this->Surf).BaseWidth = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).BaseWidth64;
    uVar5 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).BaseHeight;
    (this->Surf).BaseHeight = uVar5;
    (this->Surf).Flags.Wa = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Flags.Wa;
    aVar6 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Flags.Info;
    (this->Surf).Flags.Gpu = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Flags.Gpu;
    (this->Surf).Flags.Info = aVar6;
    (this->Surf).CachePolicy.Usage = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Usage;
    uVar12 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Pitch;
    (this->Surf).Pitch = (ulong)uVar12;
    (this->Surf).Size = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Size;
    (this->Surf).Alignment.BaseAlignment =
         (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).BaseAlignment;
    (this->Surf).MaxLod = 1;
    (this->Surf).ArraySize = 1;
    (this->Surf).CpTag = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).CpTag;
    (this->Surf).BitsPerPixel = (uint)uVar4;
    (this->Surf).Alignment.QPitch = uVar5 * uVar12;
    GmmTextureCalc::SetTileMode(this_00,pTexInfo);
    uVar7 = GmmIsPlanar((this->Surf).Format);
    if (uVar7 != '\0') {
      (*this_00->_vptr_GmmTextureCalc[0x24])(this_00,pTexInfo,CreateParams);
      (*this->_vptr_GmmResourceInfoCommon[0x7b])(this);
    }
    if ((pTexInfo->Type < RESOURCE_SVM_KERNELS_BUFFER) &&
       ((0x212c0706U >> (pTexInfo->Type & GMM_MAX_HW_RESOURCE_TYPE) & 1) != 0)) {
      uVar5 = (this->Surf).MaxLod;
      iVar9 = uVar5 + 1 + (uint)(uVar5 == 0xffffffff);
      uVar12 = iVar9 - 1;
      auVar14 = pmovsxbd(in_XMM1,0x100);
      lVar13 = 0;
      auVar15 = pmovsxbd(in_XMM2,0x2020202);
      do {
        uVar16 = auVar14._0_4_;
        uVar17 = auVar14._4_4_;
        iVar18 = auVar14._8_4_;
        iVar19 = auVar14._12_4_;
        if (((uVar12 < uVar16) * uVar12 | (uVar12 >= uVar16) * uVar16) == uVar16) {
          puVar3 = (this->Surf).MmcHint + lVar13 * 8 + 0x80;
          puVar3[0] = '\0';
          puVar3[1] = '\0';
          puVar3[2] = '\0';
          puVar3[3] = '\0';
          puVar3[4] = '\0';
          puVar3[5] = '\0';
          puVar3[6] = '\0';
          puVar3[7] = '\0';
        }
        if (((uVar12 < uVar17) * uVar12 | (uVar12 >= uVar17) * uVar17) == uVar17) {
          *(undefined8 *)((long)&(this->Surf).OffsetInfo.field_0 + lVar13 * 8 + 0x18) = 0;
        }
        auVar14._0_4_ = uVar16 + auVar15._0_4_;
        auVar14._4_4_ = uVar17 + auVar15._4_4_;
        auVar14._8_4_ = iVar18 + auVar15._8_4_;
        auVar14._12_4_ = iVar19 + auVar15._12_4_;
        lVar13 = lVar13 + 2;
      } while ((iVar9 + 1U & 0xfffffffe) != (uint)lVar13);
      if (((ulong)(this->Surf).Flags.Gpu & 0x2000000002) != 0) {
        iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
        if ((*(byte *)(CONCAT44(extraout_var_02,iVar9) + 0x1e) & 4) != 0) {
          puVar1 = &(this->AuxSurf).Flags.Gpu.field_0x5;
          *puVar1 = *puVar1 | 8;
        }
        (this->AuxSurf).Flags.Info =
             (anon_struct_8_44_94931171_for_Info)
             ((ulong)(this->AuxSurf).Flags.Info & 0xffffffd3fff7ffff | 0x80000);
        iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
        uVar11 = 0xffffffbfffffffff;
        if ((*(ushort *)(CONCAT44(extraout_var_03,iVar9) + 0x18) & 0x40) == 0) {
          uVar11 = 0xffffefffffffffff;
        }
        paVar2 = &(this->AuxSurf).Flags.Info;
        *paVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)*paVar2 & uVar11);
        iVar9 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
        uVar11 = 0xffffffefffffffff;
        if ((*(ushort *)(CONCAT44(extraout_var_04,iVar9) + 0x18) & 0x40) == 0) {
          uVar11 = 0xfffff7ffffffffff;
        }
        paVar2 = &(this->AuxSurf).Flags.Info;
        *paVar2 = (anon_struct_8_44_94931171_for_Info)((ulong)*paVar2 & uVar11);
        (this->AuxSurf).ArraySize = 1;
        (this->AuxSurf).BitsPerPixel = 8;
        uVar7 = GmmIsPlanar((CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Format);
        if ((uVar7 == '\0') &&
           (uVar7 = GmmIsUVPacked((CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).Format),
           uVar7 == '\0')) {
          GVar10 = (CreateParams->AuxSurf).Size;
        }
        else {
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x10) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.X[1];
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x30) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.Y[1];
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x18) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.X[2];
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x38) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.Y[2];
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x20) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.X[3];
          *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x40) =
               (ulong)(CreateParams->AuxSurf).PlaneOffset.Y[3];
          GVar10 = (CreateParams->AuxSurf).Size;
          (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar10;
        }
        (this->AuxSurf).Size = GVar10;
        (this->AuxSurf).Pitch = (ulong)(CreateParams->AuxSurf).Pitch;
        (this->AuxSurf).Type = RESOURCE_BUFFER;
        (this->AuxSurf).Alignment.ArraySpacingSingleLod = '\0';
        *(undefined3 *)&(this->AuxSurf).Alignment.field_0x1 = 0;
        (this->AuxSurf).Alignment.BaseAlignment = 0;
        (this->AuxSurf).Alignment.HAlign = 0;
        (this->AuxSurf).Alignment.VAlign = 0;
        (this->AuxSurf).Alignment.DAlign = 0;
        (this->AuxSurf).Alignment.MipTailStartLod = 0;
        (this->AuxSurf).Alignment.PackedMipStartLod = 0;
        (this->AuxSurf).Alignment.PackedMipWidth = 0;
        (this->AuxSurf).Alignment.PackedMipHeight = 0;
        (this->AuxSurf).Alignment.QPitch = 0;
        (this->AuxSurf).Alignment.QPitch = (uint32_t)GVar10;
        (this->AuxSurf).Alignment.BaseAlignment = (CreateParams->AuxSurf).BaseAlignment;
        uVar11 = GVar10 + 0xfff & 0xfffffffffffff000;
        (this->AuxSurf).Size = uVar11;
        if (((this->AuxSurf).Flags.Gpu.field_0x4 & 8) != 0) {
          (this->AuxSurf).Alignment.BaseAlignment = 0x10000;
          (this->AuxSurf).Size = uVar11 + 0xffff & 0xffffffffffff0000;
        }
        puVar1 = &(this->AuxSurf).Flags.Info.field_0x2;
        *(ushort *)puVar1 = *(ushort *)puVar1 & 0xcfef;
        GmmTextureCalc::SetTileMode(this_00,&this->AuxSurf);
        (this->AuxSurf).UnpaddedSize = (this->AuxSurf).Size;
        return GMM_SUCCESS;
      }
      return GMM_SUCCESS;
    }
  }
  this->_vptr_GmmResourceInfoCommon = (_func_int **)&PTR_IsPresentableformat_001c6cb8;
  this->ClientType = GMM_KMD_VISTA;
  memset(&this->Surf,0,0x61c);
  (this->ExistingSysMem).pExistingSysMem = 0;
  (this->ExistingSysMem).pVirtAddress = 0;
  (this->ExistingSysMem).pGfxAlignedVirtAddress = 0;
  (this->ExistingSysMem).Size = 0;
  *(undefined1 (*) [16])&(this->ExistingSysMem).IsGmmAllocated = (undefined1  [16])0x0;
  this->pGmmUmdLibContext = 0;
  this->pGmmKmdLibContext = 0;
  this->pPrivateData = 0;
  this->pClientContext = (GmmClientContext *)0x0;
  (this->MultiTileArch).field_0x0 = 0;
  (this->MultiTileArch).GpuVaMappingSet = '\0';
  (this->MultiTileArch).LocalMemEligibilitySet = '\0';
  (this->MultiTileArch).LocalMemPreferredSet = '\0';
  (this->MultiTileArch).Reserved = 0;
  return GMM_INVALIDPARAM;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmResourceInfoCommon::CreateCustomRes_2(Context &GmmLibContext, GMM_RESCREATE_CUSTOM_PARAMS_2 &CreateParams)
{
    const GMM_PLATFORM_INFO *pPlatform;
    GMM_STATUS               Status       = GMM_ERROR;
    GMM_TEXTURE_CALC *       pTextureCalc = NULL;
    uint32_t                 BitsPerPixel, i;


    GMM_DPF_ENTER;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);
    pGmmUmdLibContext = reinterpret_cast<uint64_t>(&GmmLibContext);
    __GMM_ASSERTPTR(pGmmUmdLibContext, GMM_ERROR);


    if((CreateParams.Format > GMM_FORMAT_INVALID) &&
       (CreateParams.Format < GMM_RESOURCE_FORMATS))
    {
        BitsPerPixel = GetGmmLibContext()->GetPlatformInfo().FormatTable[CreateParams.Format].Element.BitsPer;
    }
    else
    {
        GMM_ASSERTDPF(0, "Format Error");
        Status = GMM_INVALIDPARAM;
        goto ERROR_CASE;
    }

    pPlatform    = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    Surf.Type                    = CreateParams.Type;
    Surf.Format                  = CreateParams.Format;
    Surf.BaseWidth               = CreateParams.BaseWidth64;
    Surf.BaseHeight              = CreateParams.BaseHeight;
    Surf.Flags                   = CreateParams.Flags;
    Surf.CachePolicy.Usage       = CreateParams.Usage;
    Surf.Pitch                   = CreateParams.Pitch;
    Surf.Size                    = CreateParams.Size;
    Surf.Alignment.BaseAlignment = CreateParams.BaseAlignment;
    Surf.MaxLod                  = 1;
    Surf.ArraySize               = 1;
    Surf.CpTag                   = CreateParams.CpTag;

#if(_DEBUG || _RELEASE_INTERNAL)
    Surf.Platform = GetGmmLibContext()->GetPlatformInfo().Platform;
#endif
    Surf.BitsPerPixel     = BitsPerPixel;
    Surf.Alignment.QPitch = (GMM_GLOBAL_GFX_SIZE_T)(Surf.Pitch * Surf.BaseHeight);

    pTextureCalc->SetTileMode(&Surf);

    if(GmmIsPlanar(Surf.Format))
    {
        pTextureCalc->SetPlanarOffsetInfo_2(&Surf, CreateParams);

        if(Surf.ArraySize > 1)
        {
            //Not required as this new interface doesn't support arrayed surfaces.
        }

        UpdateUnAlignedParams();
    }

    switch(Surf.Type)
    {
        case RESOURCE_1D:
        case RESOURCE_2D:
        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
        case RESOURCE_GDI:
        case RESOURCE_NNDI:
        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
        case RESOURCE_IFFS_MAPTOGTT:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_DISPLAY:
        case RESOURCE_WGBOX_ENCODE_REFERENCE:
#endif
        {
            if(Surf.ArraySize > 1)
            {
                //Not required as this new interface doesn't support arrayed surfaces.
            }

            for(i = 0; i <= Surf.MaxLod; i++)
            {
                Surf.OffsetInfo.Texture2DOffsetInfo.Offset[i] = 0;
            }

            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "GmmTexAlloc: Unknown surface type!");
            Status = GMM_INVALIDPARAM;
            goto ERROR_CASE;
            ;
        }
    };

    if(Surf.Flags.Gpu.UnifiedAuxSurface || Surf.Flags.Gpu.CCS)
    {

        if(GetGmmLibContext()->GetSkuTable().FtrLinearCCS)
        {
            AuxSurf.Flags.Gpu.__NonMsaaLinearCCS = 1;
        }

        AuxSurf.Flags.Info.TiledW  = 0;
        AuxSurf.Flags.Info.TiledYf = 0;
        AuxSurf.Flags.Info.TiledX  = 0;
        AuxSurf.Flags.Info.Linear  = 1;
        GMM_SET_64KB_TILE(AuxSurf.Flags, 0, GetGmmLibContext());
        GMM_SET_4KB_TILE(AuxSurf.Flags, 0, GetGmmLibContext());

        AuxSurf.ArraySize    = 1;
        AuxSurf.BitsPerPixel = 8;

        if(GmmIsPlanar(CreateParams.Format) || GmmIsUVPacked(CreateParams.Format))
        {
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_Y];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_Y] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_Y];
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_U];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_U];
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_V] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_V];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_V] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_V];
            AuxSurf.OffsetInfo.Plane.ArrayQPitch    = CreateParams.AuxSurf.Size;
        }

        AuxSurf.Size = CreateParams.AuxSurf.Size;

        AuxSurf.Pitch     = CreateParams.AuxSurf.Pitch;
        AuxSurf.Type      = RESOURCE_BUFFER;
        AuxSurf.Alignment = {0};

        AuxSurf.Alignment.QPitch        = GFX_ULONG_CAST(AuxSurf.Size);
        AuxSurf.Alignment.BaseAlignment = CreateParams.AuxSurf.BaseAlignment; //TODO: TiledResource?
        AuxSurf.Size                    = GFX_ALIGN(AuxSurf.Size, PAGE_SIZE); //page-align final size

        if(AuxSurf.Flags.Gpu.TiledResource)
        {
            AuxSurf.Alignment.BaseAlignment = GMM_KBYTE(64);                          //TODO: TiledResource?
            AuxSurf.Size                    = GFX_ALIGN(AuxSurf.Size, GMM_KBYTE(64)); //page-align final size
        }

        //Clear compression request in CCS
        AuxSurf.Flags.Info.RenderCompressed = 0;
        AuxSurf.Flags.Info.MediaCompressed  = 0;
        AuxSurf.Flags.Info.RedecribedPlanes = 0;
        pTextureCalc->SetTileMode(&AuxSurf);
        AuxSurf.UnpaddedSize = AuxSurf.Size;
    }
    GMM_DPF_EXIT;
    return GMM_SUCCESS;

ERROR_CASE:
    //Zero out all the members
    new(this) GmmResourceInfoCommon();

    GMM_DPF_EXIT;
    return Status;
}